

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_short,unsigned_short(*&)(unsigned_short,unsigned_short)>
          (Memory *this,u64 offset,u64 addend,unsigned_short rhs,
          BinopFunc<unsigned_short,_unsigned_short> **func,unsigned_short *out)

{
  ulong uVar1;
  unsigned_short uVar2;
  pointer puVar3;
  unsigned_short uVar4;
  ulong uVar5;
  Enum EVar6;
  
  puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  EVar6 = Error;
  if ((((1 < uVar5) && (offset <= uVar5)) && (addend <= uVar5)) &&
     ((uVar1 = addend + offset, (uVar1 & 1) == 0 && (uVar1 + 2 <= uVar5)))) {
    uVar2 = *(unsigned_short *)(puVar3 + uVar1);
    uVar4 = (**func)(uVar2,rhs);
    puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
    if (((uVar1 + 2 <= uVar5) && ((1 < uVar5 && (offset <= uVar5)))) && (addend <= uVar5)) {
      *(unsigned_short *)(puVar3 + uVar1) = uVar4;
      *out = uVar2;
      EVar6 = Ok;
    }
  }
  return (Result)EVar6;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}